

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O0

int64_t __thiscall
cmDebugger::cmDebuggerBreakpointManager::FindFunctionStartLine
          (cmDebuggerBreakpointManager *this,string *sourcePath,int64_t line)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer pcVar3;
  __normal_iterator<cmDebugger::cmDebuggerFunctionLocation_*,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>
  local_50;
  cmDebuggerFunctionLocation *local_48;
  cmDebuggerFunctionLocation *local_40;
  __normal_iterator<cmDebugger::cmDebuggerFunctionLocation_*,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>
  local_38;
  __normal_iterator<cmDebugger::cmDebuggerFunctionLocation_*,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>
  local_30;
  __normal_iterator<cmDebugger::cmDebuggerFunctionLocation_*,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>
  location;
  int64_t line_local;
  string *sourcePath_local;
  cmDebuggerBreakpointManager *this_local;
  
  location._M_current = (cmDebuggerFunctionLocation *)line;
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>_>
           ::operator[](&this->ListFileFunctionLines,sourcePath);
  local_38._M_current =
       (cmDebuggerFunctionLocation *)
       std::
       vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>
       ::begin(pmVar2);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>_>
           ::operator[](&this->ListFileFunctionLines,sourcePath);
  local_40 = (cmDebuggerFunctionLocation *)
             std::
             vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>
             ::end(pmVar2);
  local_48 = location._M_current;
  local_30 = std::
             find_if<__gnu_cxx::__normal_iterator<cmDebugger::cmDebuggerFunctionLocation*,std::vector<cmDebugger::cmDebuggerFunctionLocation,std::allocator<cmDebugger::cmDebuggerFunctionLocation>>>,cmDebugger::cmDebuggerBreakpointManager::FindFunctionStartLine(std::__cxx11::string_const&,long)::__0>
                       (local_38,(__normal_iterator<cmDebugger::cmDebuggerFunctionLocation_*,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>
                                  )local_40,location._M_current);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>_>
           ::operator[](&this->ListFileFunctionLines,sourcePath);
  local_50._M_current =
       (cmDebuggerFunctionLocation *)
       std::
       vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>
       ::end(pmVar2);
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_50);
  if (bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<cmDebugger::cmDebuggerFunctionLocation_*,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>
             ::operator->(&local_30);
    this_local = (cmDebuggerBreakpointManager *)pcVar3->StartLine;
  }
  else {
    this_local = (cmDebuggerBreakpointManager *)0x0;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t cmDebuggerBreakpointManager::FindFunctionStartLine(
  std::string const& sourcePath, int64_t line)
{
  auto location =
    find_if(ListFileFunctionLines[sourcePath].begin(),
            ListFileFunctionLines[sourcePath].end(),
            [=](cmDebuggerFunctionLocation const& loc) {
              return loc.StartLine <= line && loc.EndLine >= line;
            });

  if (location != ListFileFunctionLines[sourcePath].end()) {
    return location->StartLine;
  }

  return 0;
}